

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::MakeProtoProtoPathRelative
          (CommandLineInterface *this,DiskSourceTree *source_tree,string *proto,
          DescriptorDatabase *fallback_database)

{
  bool bVar1;
  int iVar2;
  DiskFileToVirtualFileResult DVar3;
  char *pcVar4;
  ostream *poVar5;
  int *piVar6;
  long *in_RCX;
  string *in_RDX;
  string disk_file_1;
  string shadowing_disk_file;
  string virtual_file;
  string disk_file;
  bool in_fallback_database;
  FileDescriptorProto fallback_file;
  FileDescriptorProto *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  DiskSourceTree *in_stack_fffffffffffffdd0;
  DiskSourceTree *this_00;
  FileDescriptorProto *in_stack_fffffffffffffe10;
  byte local_1a1;
  string local_1a0 [16];
  pointer in_stack_fffffffffffffe70;
  pointer in_stack_fffffffffffffe78;
  string *in_stack_fffffffffffffe80;
  DiskSourceTree *in_stack_fffffffffffffe88;
  string local_160 [36];
  undefined4 local_13c;
  string local_138 [55];
  byte local_101;
  undefined1 local_100 [216];
  long *local_28;
  string *local_20;
  byte local_1;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  FileDescriptorProto::FileDescriptorProto(in_stack_fffffffffffffe10);
  local_1a1 = 0;
  if (local_28 != (long *)0x0) {
    local_1a1 = (**(code **)(*local_28 + 0x10))(local_28,local_20,local_100);
  }
  local_101 = local_1a1 & 1;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = access(pcVar4,0);
  if (iVar2 < 0) {
    std::__cxx11::string::string(local_138);
    bVar1 = DiskSourceTree::VirtualFileToDiskFile
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                       (string *)in_stack_fffffffffffffdc0);
    if ((bVar1) || ((local_101 & 1) != 0)) {
      local_1 = 1;
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,local_20);
      poVar5 = std::operator<<(poVar5,": ");
      pcVar4 = strerror(2);
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
    }
    local_13c = 1;
    std::__cxx11::string::~string(local_138);
  }
  else {
    std::__cxx11::string::string(local_160);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffe80);
    DVar3 = DiskSourceTree::DiskFileToVirtualFile
                      (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                       &in_stack_fffffffffffffe78->virtual_path,
                       &in_stack_fffffffffffffe70->virtual_path);
    switch(DVar3) {
    case SUCCESS:
      std::__cxx11::string::operator=(local_20,local_160);
    default:
      local_1 = 1;
      local_13c = 1;
      break;
    case SHADOWED:
      poVar5 = std::operator<<((ostream *)&std::cerr,local_20);
      poVar5 = std::operator<<(poVar5,": Input is shadowed in the --proto_path by \"");
      poVar5 = std::operator<<(poVar5,(string *)&stack0xfffffffffffffe80);
      poVar5 = std::operator<<(poVar5,
                               "\".  Either use the latter file as your input or reorder the --proto_path so that the former file\'s location comes first."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_13c = 1;
      break;
    case CANNOT_OPEN:
      if ((local_101 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,local_20);
        poVar5 = std::operator<<(poVar5,": ");
        piVar6 = __errno_location();
        pcVar4 = strerror(*piVar6);
        poVar5 = std::operator<<(poVar5,pcVar4);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
        local_13c = 1;
      }
      else {
        local_1 = 1;
        local_13c = 1;
      }
      break;
    case NO_MAPPING:
      this_00 = (DiskSourceTree *)local_1a0;
      std::__cxx11::string::string((string *)this_00);
      bVar1 = DiskSourceTree::VirtualFileToDiskFile
                        (this_00,in_stack_fffffffffffffdc8,(string *)in_stack_fffffffffffffdc0);
      if ((bVar1) || ((local_101 & 1) != 0)) {
        local_1 = 1;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,local_20);
        in_stack_fffffffffffffdc0 =
             (FileDescriptorProto *)
             std::operator<<(poVar5,
                             ": File does not reside within any path specified using --proto_path (or -I).  You must specify a --proto_path which encompasses this file.  Note that the proto_path must be an exact prefix of the .proto file names -- protoc is too dumb to figure out when two paths (e.g. absolute and relative) are equivalent (it\'s harder than you think)."
                            );
        std::ostream::operator<<(in_stack_fffffffffffffdc0,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      local_13c = 1;
      std::__cxx11::string::~string(local_1a0);
    }
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
    std::__cxx11::string::~string(local_160);
  }
  FileDescriptorProto::~FileDescriptorProto(in_stack_fffffffffffffdc0);
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineInterface::MakeProtoProtoPathRelative(
    DiskSourceTree* source_tree, std::string* proto,
    DescriptorDatabase* fallback_database) {
  // If it's in the fallback db, don't report non-existent file errors.
  FileDescriptorProto fallback_file;
  bool in_fallback_database =
      fallback_database != nullptr &&
      fallback_database->FindFileByName(*proto, &fallback_file);

  // If the input file path is not a physical file path, it must be a virtual
  // path.
  if (access(proto->c_str(), F_OK) < 0) {
    std::string disk_file;
    if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
        in_fallback_database) {
      return true;
    } else {
      std::cerr << *proto << ": " << strerror(ENOENT) << std::endl;
      return false;
    }
  }

  std::string virtual_file, shadowing_disk_file;
  switch (source_tree->DiskFileToVirtualFile(*proto, &virtual_file,
                                             &shadowing_disk_file)) {
    case DiskSourceTree::SUCCESS:
      *proto = virtual_file;
      break;
    case DiskSourceTree::SHADOWED:
      std::cerr << *proto << ": Input is shadowed in the --proto_path by \""
                << shadowing_disk_file
                << "\".  Either use the latter file as your input or reorder "
                   "the --proto_path so that the former file's location "
                   "comes first."
                << std::endl;
      return false;
    case DiskSourceTree::CANNOT_OPEN:
      if (in_fallback_database) {
        return true;
      }
      std::cerr << *proto << ": " << strerror(errno) << std::endl;
      return false;
    case DiskSourceTree::NO_MAPPING: {
      // Try to interpret the path as a virtual path.
      std::string disk_file;
      if (source_tree->VirtualFileToDiskFile(*proto, &disk_file) ||
          in_fallback_database) {
        return true;
      } else {
        // The input file path can't be mapped to any --proto_path and it also
        // can't be interpreted as a virtual path.
        std::cerr
            << *proto
            << ": File does not reside within any path "
               "specified using --proto_path (or -I).  You must specify a "
               "--proto_path which encompasses this file.  Note that the "
               "proto_path must be an exact prefix of the .proto file "
               "names -- protoc is too dumb to figure out when two paths "
               "(e.g. absolute and relative) are equivalent (it's harder "
               "than you think)."
            << std::endl;
        return false;
      }
    }
  }
  return true;
}